

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inference.cpp
# Opt level: O2

ostream * Kernel::operator<<(ostream *out,Inference *self)

{
  ostream *poVar1;
  InferenceRule in_DL;
  InferenceRule extraout_DL;
  char *pcVar2;
  string sStack_38;
  
  switch((uint)*(undefined8 *)self & 3) {
  case 0:
    pcVar2 = "INFERENCE_012, (";
    break;
  case 1:
    pcVar2 = "INFERENCE_MANY, (";
    break;
  case 2:
    pcVar2 = "INFERENCE_FROM_SAT_REFUTATION, (";
    break;
  case 3:
    goto switchD_0042a49e_caseD_3;
  }
  std::operator<<(out,pcVar2);
  in_DL = extraout_DL;
switchD_0042a49e_caseD_3:
  ruleName_abi_cxx11_(&sStack_38,(Kernel *)(ulong)(byte)self->field_0x1,in_DL);
  std::operator<<(out,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  poVar1 = std::operator<<(out,"), it: ");
  std::operator<<(poVar1,*(byte *)self >> 2 & 7);
  poVar1 = std::operator<<(out,", incl: ");
  std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(out,", ptd: ");
  std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  if (*(char *)(Lib::env + 0xec92) == '\x01') {
    poVar1 = std::operator<<(out,", cad: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  if (*(char *)(Lib::env + 0xed6a) == '\x01') {
    poVar1 = std::operator<<(out,", pad: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  if ((*(char *)(Lib::env + 0xec92) == '\x01') && (*(char *)(Lib::env + 0xed6a) == '\x01')) {
    poVar1 = std::operator<<(out,", had: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  poVar1 = std::operator<<(out,", id: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  if (0 < *(int *)(Lib::env + 0xf358)) {
    poVar1 = std::operator<<(out,", xxNarrs ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  if (*(char *)(Lib::env + 0xf27a) == '\x01') {
    poVar1 = std::operator<<(out,", redLen ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  poVar1 = std::operator<<(out,", sl: ");
  std::operator<<(poVar1,self->field_0x4);
  poVar1 = std::operator<<(out,", age: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(out,", thAx:");
  std::ostream::operator<<(poVar1,(int)self->th_ancestors);
  poVar1 = std::operator<<(out,", allAx:");
  std::ostream::operator<<(poVar1,(int)self->all_ancestors);
  return out;
}

Assistant:

std::ostream& Kernel::operator<<(std::ostream& out, Inference const& self)
{
  switch(self._kind) {
    case Inference::Kind::INFERENCE_012:
      out << "INFERENCE_012, (";
      break;
    case Inference::Kind::INFERENCE_MANY:
      out << "INFERENCE_MANY, (";
      break;
    case Inference::Kind::INFERENCE_FROM_SAT_REFUTATION:
      out << "INFERENCE_FROM_SAT_REFUTATION, (";
      break;
  }
  // TODO get rid of intermediate string generation by ruleName
  out << ruleName(self._rule);
  out << "), it: " << toNumber(self._inputType);

  out << ", incl: " << self._included;
  out << ", ptd: " << self._isPureTheoryDescendant;
  if(env.options->addCombAxioms()){
    out << ", cad: " << self._combAxiomsDescendant;
  }
  if(env.options->addProxyAxioms()){
     out << ", pad: " << self._proxyAxiomsDescendant;
  }
  if(env.options->addCombAxioms() && env.options->addProxyAxioms()){
    out << ", had: " << self._holAxiomsDescendant;
  }
  out << ", id: " << self._inductionDepth;
  if(env.options->maxXXNarrows() > 0){
    out << ", xxNarrs " << self._XXNarrows;
  }
  if(env.options->prioritiseClausesProducedByLongReduction()){
    out << ", redLen " << self._reductions;
  }
  out << ", sl: " << self._sineLevel;
  out << ", age: " << self._age;
  out << ", thAx:" << (int)(self.th_ancestors);
  out << ", allAx:" << (int)(self.all_ancestors);

  return out;
}